

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O1

C_Node * new_sub(C_Parser *parser,C_Node *lhs,C_Node *rhs,C_Token *tok)

{
  int iVar1;
  C_Type *pCVar2;
  C_Obj *pCVar3;
  _Bool _Var4;
  C_Node *pCVar5;
  C_Node *pCVar6;
  C_Node *pCVar7;
  
  C_add_type(parser,lhs);
  C_add_type(parser,rhs);
  _Var4 = C_is_numeric(lhs->ty);
  if ((_Var4) && (_Var4 = C_is_numeric(rhs->ty), _Var4)) {
    pCVar5 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar5->kind = ND_SUB;
    pCVar5->tok = tok;
    pCVar5->lhs = lhs;
    pCVar5->rhs = rhs;
    return pCVar5;
  }
  pCVar2 = lhs->ty->base;
  if (pCVar2->kind == TY_VLA) {
    pCVar3 = pCVar2->vla_size;
    pCVar5 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar5->kind = ND_VAR;
    pCVar5->tok = tok;
    pCVar5->var = pCVar3;
  }
  else {
    _Var4 = C_is_integer(rhs->ty);
    pCVar2 = lhs->ty->base;
    if (!_Var4) {
      if ((pCVar2 != (C_Type *)0x0) && (rhs->ty->base != (C_Type *)0x0)) {
        pCVar5 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar5->kind = ND_SUB;
        pCVar5->tok = tok;
        pCVar5->lhs = lhs;
        pCVar5->rhs = rhs;
        pCVar5->ty = C_ty_long;
        iVar1 = lhs->ty->base->size;
        pCVar6 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar6->kind = ND_NUM;
        pCVar6->tok = tok;
        pCVar6->val = (long)iVar1;
        pCVar7 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar7->kind = ND_DIV;
        pCVar7->tok = tok;
        pCVar7->lhs = pCVar5;
        pCVar7->rhs = pCVar6;
        return pCVar7;
      }
      C_error_tok(parser,tok,"invalid operands");
    }
    iVar1 = pCVar2->size;
    pCVar5 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar5->kind = ND_NUM;
    pCVar5->tok = tok;
    pCVar5->val = (long)iVar1;
    pCVar5->ty = C_ty_long;
  }
  pCVar6 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
  pCVar6->kind = ND_MUL;
  pCVar6->tok = tok;
  pCVar6->lhs = rhs;
  pCVar6->rhs = pCVar5;
  C_add_type(parser,pCVar6);
  pCVar5 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
  pCVar5->kind = ND_SUB;
  pCVar5->tok = tok;
  pCVar5->lhs = lhs;
  pCVar5->rhs = pCVar6;
  pCVar5->ty = lhs->ty;
  return pCVar5;
}

Assistant:

static C_Node *new_sub(C_Parser *parser, C_Node *lhs, C_Node *rhs, C_Token *tok) {
  C_add_type(parser, lhs);
  C_add_type(parser, rhs);

  // num - num
  if (C_is_numeric(lhs->ty) && C_is_numeric(rhs->ty))
    return new_binary(parser, ND_SUB, lhs, rhs, tok);

  // VLA + num
  if (lhs->ty->base->kind == TY_VLA) {
    rhs = new_binary(parser, ND_MUL, rhs, new_var_node(parser, lhs->ty->base->vla_size, tok), tok);
    C_add_type(parser, rhs);
    C_Node *node = new_binary(parser, ND_SUB, lhs, rhs, tok);
    node->ty = lhs->ty;
    return node;
  }

  // ptr - num
  if (lhs->ty->base && C_is_integer(rhs->ty)) {
    rhs = new_binary(parser, ND_MUL, rhs, new_long(parser, lhs->ty->base->size, tok), tok);
    C_add_type(parser, rhs);
    C_Node *node = new_binary(parser, ND_SUB, lhs, rhs, tok);
    node->ty = lhs->ty;
    return node;
  }

  // ptr - ptr, which returns how many elements are between the two.
  if (lhs->ty->base && rhs->ty->base) {
    C_Node *node = new_binary(parser, ND_SUB, lhs, rhs, tok);
    node->ty = C_ty_long;
    return new_binary(parser, ND_DIV, node, new_num(parser, lhs->ty->base->size, tok), tok);
  }

  C_error_tok(parser, tok, "invalid operands");
  return NULL;
}